

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpk_algorithm.c
# Opt level: O1

void fpk_a(void)

{
  long lVar1;
  long lVar2;
  long lVar3;
  solver_state_a s;
  int local_110 [4];
  long local_100;
  long local_f8;
  long local_f0;
  
  setup_simple_state_a(&two_dof_robot_a,local_110);
  if (0 < local_110[0]) {
    lVar2 = 0;
    lVar3 = 0;
    lVar1 = 0;
    do {
      kca_fpk(_two_dof_robot_c + lVar2 + 0x20,local_100 + lVar3);
      ga_pose_compose(local_100 + lVar3,_two_dof_robot_c + lVar2,local_f8 + lVar3);
      ga_pose_compose(local_f8 + lVar3,local_f0 + lVar3,local_f0 + lVar3 + 0x20);
      lVar1 = lVar1 + 1;
      lVar3 = lVar3 + 0x20;
      lVar2 = lVar2 + 0x60;
    } while (lVar1 < local_110[0]);
  }
  ga_pose_log((long)local_110[0] * 0x20 + local_f0);
  return;
}

Assistant:

void fpk_a()
{
    struct kca_kinematic_chain *kc = &two_dof_robot_a;
    struct solver_state_a s;

    setup_simple_state_a(kc, &s);


    for (int i = 1; i < s.nbody + 1; i++) {
        struct kca_joint *joint = &kc->segment[i - 1].joint;

        // Position
        //

        // X_{J,i}
        kca_fpk(joint, &s.x_jnt[i - 1]);

        // i^X_{i-1} = X_{J,i} X_{T,i}
        ga_pose_compose(&s.x_jnt[i - 1], &kc->segment[i - 1].joint_attachment, &s.x_rel[i - 1]);

        // i^X_0 = i^X_{i-1} {i-1}^X_0
        ga_pose_compose(&s.x_rel[i - 1], &s.x_tot[i - 1], &s.x_tot[i]);
    }

    ga_pose_log(&s.x_tot[s.nbody]);
}